

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O1

ssize_t __thiscall
kj::PausableReadAsyncIoStream::write
          (PausableReadAsyncIoStream *this,int __fd,void *__buf,size_t __n)

{
  AsyncIoStream *pAVar1;
  undefined8 node;
  undefined4 in_register_00000034;
  undefined1 local_30 [32];
  
  pAVar1 = (((PausableReadAsyncIoStream *)CONCAT44(in_register_00000034,__fd))->inner).ptr;
  (**(pAVar1->super_AsyncOutputStream)._vptr_AsyncOutputStream)
            (local_30,&pAVar1->super_AsyncOutputStream);
  trackWrite((Deferred<kj::Function<void_()>_> *)(local_30 + 8),
             (PausableReadAsyncIoStream *)CONCAT44(in_register_00000034,__fd));
  Promise<void>::attach<kj::_::Deferred<kj::Function<void()>>>
            ((Promise<void> *)this,(Deferred<kj::Function<void_()>_> *)local_30);
  kj::_::Deferred<kj::Function<void_()>_>::~Deferred
            ((Deferred<kj::Function<void_()>_> *)(local_30 + 8));
  node = local_30._0_8_;
  if ((PromiseArenaMember *)local_30._0_8_ != (PromiseArenaMember *)0x0) {
    local_30._0_8_ = 0;
    kj::_::PromiseDisposer::dispose((PromiseArenaMember *)node);
  }
  return (ssize_t)this;
}

Assistant:

kj::Promise<void> PausableReadAsyncIoStream::write(ArrayPtr<const byte> buffer) {
  return inner->write(buffer).attach(trackWrite());
}